

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Target.cpp
# Opt level: O2

ReadBuffer __thiscall SCSI::Target::CommandState::read_buffer_specs(CommandState *this)

{
  pointer puVar1;
  ulong uVar2;
  ReadBuffer RVar3;
  
  puVar1 = (this->data_->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = 4;
  if ((puVar1[1] & 7) < 4) {
    uVar2 = (ulong)(puVar1[1] & 7);
  }
  RVar3._0_8_ = uVar2 | (ulong)puVar1[2] << 0x20;
  RVar3._8_8_ = (ulong)((uint)puVar1[8] | (uint)puVar1[7] << 8 | (uint)puVar1[6] << 0x10) << 0x20 |
                (ulong)puVar1[5] | (ulong)((uint)puVar1[4] << 8 | (uint)puVar1[3] << 0x10);
  return RVar3;
}

Assistant:

CommandState::ReadBuffer CommandState::read_buffer_specs() const {
	ReadBuffer specs;

	specs.mode = ReadBuffer::Mode(data_[1]&7);
	if(specs.mode > ReadBuffer::Mode::Reserved) specs.mode = ReadBuffer::Mode::Reserved;
	specs.buffer_id = data_[2];
	specs.buffer_offset = uint32_t((data_[3] << 16) | (data_[4] << 8) | data_[5]);
	specs.buffer_length = uint32_t((data_[6] << 16) | (data_[7] << 8) | data_[8]);

	return specs;
}